

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LRNLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_lrn(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xb4) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xb4;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    LRNLayerParams::LRNLayerParams(this_00.lrn_);
    (this->layer_).lrn_ = (LRNLayerParams *)this_00;
  }
  return (LRNLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LRNLayerParams* NeuralNetworkLayer::mutable_lrn() {
  if (!has_lrn()) {
    clear_layer();
    set_has_lrn();
    layer_.lrn_ = new ::CoreML::Specification::LRNLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.lrn)
  return layer_.lrn_;
}